

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiple_undo.cpp
# Opt level: O3

bool handler_selective_new_allowed_proc
               (Am_Object *command_obj,Am_Value *new_selection,Am_Value *new_value)

{
  Am_Selective_New_Allowed_Method_Type *pAVar1;
  bool bVar2;
  bool bVar3;
  Am_Value *pAVar4;
  ulong in_RCX;
  anon_union_8_8_ea4c8939_for_value in_R8;
  Am_Value AVar5;
  Am_Value AVar6;
  Am_Value value;
  Am_Selective_Repeat_New_Method method;
  Am_Selective_New_Allowed_Method allowed_method;
  undefined1 local_90 [8];
  Am_Value local_88;
  Am_Selective_Repeat_New_Method local_78;
  Am_Selective_New_Allowed_Method local_68;
  undefined1 local_50 [16];
  Am_Value local_40;
  
  local_68.from_wrapper = (Am_Method_Wrapper *)0x0;
  local_68.Call = (Am_Selective_New_Allowed_Method_Type *)0x0;
  local_88.type = 0;
  local_88.value.wrapper_value = (Am_Wrapper *)0x0;
  while( true ) {
    bVar2 = Am_Object::Valid(command_obj);
    if (!bVar2) break;
    pAVar4 = Am_Object::Get(command_obj,0x14d,4);
    Am_Selective_New_Allowed_Method::operator=(&local_68,pAVar4);
    pAVar1 = local_68.Call;
    if (local_68.Call != (Am_Selective_New_Allowed_Method_Type *)0x0) {
      Am_Object::Am_Object((Am_Object *)local_90,command_obj);
      Am_Value::Am_Value(&local_40,new_selection);
      Am_Value::Am_Value((Am_Value *)local_50,new_value);
      AVar5.value.wrapper_value = (Am_Wrapper *)local_50;
      AVar5._0_8_ = &local_40;
      AVar6.value.wrapper_value = in_R8.wrapper_value;
      AVar6._0_8_ = in_RCX;
      bVar2 = (*pAVar1)((Am_Object_Data *)local_90,AVar5,AVar6);
      Am_Value::~Am_Value((Am_Value *)local_50);
      Am_Value::~Am_Value(&local_40);
      Am_Object::~Am_Object((Am_Object *)local_90);
      if (!bVar2) break;
    }
    local_78.from_wrapper = (Am_Method_Wrapper *)0x0;
    local_78.Call = (Am_Selective_Repeat_New_Method_Type *)0x0;
    pAVar4 = Am_Object::Get(command_obj,0x14a,4);
    Am_Selective_Repeat_New_Method::operator=(&local_78,pAVar4);
    bVar2 = local_78.Call != (Am_Selective_Repeat_New_Method_Type *)0x0;
    if (bVar2) goto LAB_001c165a;
    pAVar4 = Am_Object::Get(command_obj,0x167,5);
    Am_Value::operator=(&local_88,pAVar4);
    bVar3 = Am_Value::Valid(&local_88);
    in_RCX = (ulong)CONCAT11((char)(local_88.type >> 8),local_88.type == 0xa001);
    if (!bVar3 || local_88.type != 0xa001) goto LAB_001c165a;
    Am_Object::operator=(command_obj,&local_88);
  }
  bVar2 = false;
LAB_001c165a:
  Am_Value::~Am_Value(&local_88);
  return bVar2;
}

Assistant:

Am_Define_Method(Am_Selective_New_Allowed_Method, bool,
                 handler_selective_new_allowed,
                 (Am_Object command_obj, Am_Value new_selection,
                  Am_Value new_value))
{
  Am_Selective_New_Allowed_Method allowed_method;
  Am_Value value;
  while (true) {
    if (!command_obj.Valid())
      return false;
    allowed_method =
        command_obj.Get(Am_SELECTIVE_REPEAT_NEW_ALLOWED, Am_NO_DEPENDENCY);
    if (allowed_method.Valid())
      if (!(allowed_method.Call(command_obj, new_selection, new_value)))
        return false;
    Am_Selective_Repeat_New_Method method;
    method =
        command_obj.Get(Am_SELECTIVE_REPEAT_ON_NEW_METHOD, Am_NO_DEPENDENCY);
    if (method.Valid())
      return true;
    value = command_obj.Peek(Am_IMPLEMENTATION_CHILD, Am_NO_DEPENDENCY);
    if (value.Valid() && value.type == Am_OBJECT)
      command_obj = value;
    else
      return false;
  }
}